

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

civil_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneInfo *this,civil_second *cs)

{
  Transition *pTVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pTVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar111;
  Transition *pTVar112;
  diff_t dVar113;
  int_least64_t iVar114;
  detail *pdVar115;
  Transition *pTVar116;
  int iVar117;
  long lVar118;
  undefined8 uVar119;
  ulong uVar120;
  long c4_shift;
  fields fVar121;
  civil_second local_60;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined1 local_34;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined6 uVar39;
  undefined6 uVar40;
  undefined6 uVar41;
  undefined6 uVar42;
  undefined6 uVar43;
  undefined6 uVar44;
  undefined6 uVar45;
  undefined6 uVar46;
  undefined6 uVar47;
  undefined6 uVar48;
  undefined6 uVar49;
  undefined6 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined5 uVar63;
  undefined5 uVar64;
  undefined5 uVar65;
  undefined5 uVar66;
  undefined5 uVar67;
  undefined5 uVar68;
  undefined5 uVar69;
  undefined5 uVar70;
  undefined5 uVar71;
  undefined5 uVar72;
  undefined5 uVar73;
  undefined5 uVar74;
  undefined1 uVar75;
  undefined1 uVar76;
  undefined1 uVar77;
  undefined1 uVar78;
  undefined1 uVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined3 uVar99;
  undefined3 uVar100;
  undefined3 uVar101;
  undefined3 uVar102;
  undefined3 uVar103;
  undefined3 uVar104;
  undefined3 uVar105;
  undefined3 uVar106;
  undefined3 uVar107;
  undefined3 uVar108;
  undefined3 uVar109;
  undefined3 uVar110;
  
  pTVar116 = (this->transitions_).
             super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->transitions_).
           super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar118 = (long)pTVar1 - (long)pTVar116;
  if (lVar118 == 0) {
    __assert_fail("timecnt != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                  ,0x39f,
                  "virtual time_zone::civil_lookup absl::time_internal::cctz::TimeZoneInfo::MakeTime(const civil_second &) const"
                 );
  }
  bVar111 = detail::operator<(cs,&pTVar116->civil_sec);
  if (bVar111) {
LAB_0010ec2f:
    bVar111 = detail::operator<(&pTVar116->prev_civil_sec,cs);
    if (!bVar111) {
      pTVar7 = (this->transition_types_).
               super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar120 = (ulong)((uint)this->default_transition_type_ * 0x30);
      bVar111 = detail::operator<(cs,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                      *)((long)&(pTVar7->civil_min).f_.y + uVar120));
      if (bVar111) {
        __return_storage_ptr__->kind = UNIQUE;
        lVar118 = -0x8000000000000000;
        goto LAB_0010ef47;
      }
      pdVar115 = (detail *)(cs->f_).y;
      uVar8._0_1_ = (cs->f_).m;
      uVar20 = (cs->f_).d;
      uVar32 = (cs->f_).hh;
      uVar56 = (cs->f_).mm;
      uVar80 = (cs->f_).ss;
      uVar104 = *(undefined3 *)&(cs->f_).field_0xd;
      uVar92 = CONCAT31(uVar104,uVar80);
      uVar68 = CONCAT41(uVar92,uVar56);
      uVar44 = CONCAT51(uVar68,uVar32);
      uVar8._1_7_ = CONCAT61(uVar44,uVar20);
      fVar121 = detail::step(0x7b2,0x101,(long)*(int *)((long)&pTVar7->utc_offset + uVar120));
      dVar113 = detail::difference(pdVar115,uVar8,fVar121.y,fVar121._8_8_ & 0xffffffffff);
      iVar117 = ((int)uVar8._1_7_ >> 0x18) - (fVar121._9_4_ >> 0x18);
      lVar118 = dVar113 * 0x3c;
LAB_0010ef3d:
      lVar118 = lVar118 + iVar117;
      __return_storage_ptr__->kind = UNIQUE;
LAB_0010ef47:
      (__return_storage_ptr__->post).__d.__r = lVar118;
      (__return_storage_ptr__->trans).__d.__r = lVar118;
      (__return_storage_ptr__->pre).__d.__r = lVar118;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->kind = SKIPPED;
    uVar4._0_1_ = (cs->f_).m;
    uVar17 = (cs->f_).d;
    uVar29 = (cs->f_).hh;
    uVar53 = (cs->f_).mm;
    uVar77 = (cs->f_).ss;
    uVar101 = *(undefined3 *)&(cs->f_).field_0xd;
    uVar89 = CONCAT31(uVar101,uVar77);
    uVar65 = CONCAT41(uVar89,uVar53);
    uVar41 = CONCAT51(uVar65,uVar29);
    uVar4._1_7_ = CONCAT61(uVar41,uVar17);
    lVar118 = pTVar116->unix_time;
    uVar5._0_1_ = (pTVar116->prev_civil_sec).f_.m;
    uVar18 = (pTVar116->prev_civil_sec).f_.d;
    uVar30 = (pTVar116->prev_civil_sec).f_.hh;
    uVar54 = (pTVar116->prev_civil_sec).f_.mm;
    uVar78 = (pTVar116->prev_civil_sec).f_.ss;
    uVar102 = *(undefined3 *)&(pTVar116->prev_civil_sec).f_.field_0xd;
    uVar90 = CONCAT31(uVar102,uVar78);
    uVar66 = CONCAT41(uVar90,uVar54);
    uVar42 = CONCAT51(uVar66,uVar30);
    uVar5._1_7_ = CONCAT61(uVar42,uVar18);
    dVar113 = detail::difference((detail *)(cs->f_).y,uVar4,(pTVar116->prev_civil_sec).f_.y,uVar5);
    (__return_storage_ptr__->pre).__d.__r =
         dVar113 * 0x3c + lVar118 + (long)(((int)uVar4._1_7_ >> 0x18) - ((int)uVar5._1_7_ >> 0x18))
         + -1;
    iVar114 = pTVar116->unix_time;
    (__return_storage_ptr__->trans).__d.__r = iVar114;
    pdVar115 = (detail *)(pTVar116->civil_sec).f_.y;
    uVar119._0_1_ = (pTVar116->civil_sec).f_.m;
    uVar119._1_1_ = (pTVar116->civil_sec).f_.d;
    uVar119._2_1_ = (pTVar116->civil_sec).f_.hh;
    uVar119._3_1_ = (pTVar116->civil_sec).f_.mm;
    uVar119._4_1_ = (pTVar116->civil_sec).f_.ss;
    uVar119._5_3_ = *(undefined3 *)&(pTVar116->civil_sec).f_.field_0xd;
  }
  else {
    pTVar112 = (Transition *)(lVar118 + (long)pTVar116);
    bVar111 = detail::operator<(cs,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                    *)((long)(this->transitions_).
                                             super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      lVar118 + -0x20));
    if (bVar111) {
      uVar120 = (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i;
      if ((((uVar120 == 0) ||
           ((ulong)(((long)pTVar1 - (long)pTVar116 >> 4) * -0x5555555555555555) <= uVar120)) ||
          (bVar111 = detail::operator<(cs,&(this->transitions_).
                                           super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar120 - 1].
                                           civil_sec), bVar111)) ||
         (bVar111 = detail::operator<(cs,&(this->transitions_).
                                          super__Vector_base<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar120].
                                          civil_sec), !bVar111)) {
        local_60.f_.y = 0;
        local_60.f_._8_8_ = local_60.f_._8_8_ & 0xffffffffffffff00;
        local_50 = (undefined4)(cs->f_).y;
        uStack_4c = *(undefined4 *)((long)&(cs->f_).y + 4);
        uStack_48._0_1_ = (cs->f_).m;
        uStack_48._1_1_ = (cs->f_).d;
        uStack_48._2_1_ = (cs->f_).hh;
        uStack_48._3_1_ = (cs->f_).mm;
        uStack_44 = *(undefined4 *)&(cs->f_).ss;
        local_40 = 0x7b2;
        local_38 = 0x101;
        local_34 = 0;
        pTVar112 = std::
                   __upper_bound<absl::lts_20240722::time_internal::cctz::Transition_const*,absl::lts_20240722::time_internal::cctz::Transition,__gnu_cxx::__ops::_Val_comp_iter<absl::lts_20240722::time_internal::cctz::Transition::ByCivilTime>>
                             (pTVar116,pTVar112);
        (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i =
             ((long)pTVar112 - (long)pTVar116 >> 4) * -0x5555555555555555;
      }
      else {
        pTVar112 = pTVar116 + uVar120;
      }
    }
    bVar111 = pTVar112 == pTVar116;
    pTVar116 = pTVar112;
    if (bVar111) goto LAB_0010ec2f;
    if (pTVar112 == pTVar1) {
      bVar111 = detail::operator<(&pTVar112[-1].prev_civil_sec,cs);
      if (!bVar111) {
LAB_0010ee3d:
        __return_storage_ptr__->kind = REPEATED;
        lVar118 = pTVar112[-1].unix_time;
        uVar9._0_1_ = pTVar112[-1].prev_civil_sec.f_.m;
        uVar21 = pTVar112[-1].prev_civil_sec.f_.d;
        uVar33 = pTVar112[-1].prev_civil_sec.f_.hh;
        uVar57 = pTVar112[-1].prev_civil_sec.f_.mm;
        uVar81 = pTVar112[-1].prev_civil_sec.f_.ss;
        uVar105 = *(undefined3 *)&pTVar112[-1].prev_civil_sec.f_.field_0xd;
        uVar93 = CONCAT31(uVar105,uVar81);
        uVar69 = CONCAT41(uVar93,uVar57);
        uVar45 = CONCAT51(uVar69,uVar33);
        uVar9._1_7_ = CONCAT61(uVar45,uVar21);
        uVar10._0_1_ = (cs->f_).m;
        uVar22 = (cs->f_).d;
        uVar34 = (cs->f_).hh;
        uVar58 = (cs->f_).mm;
        uVar82 = (cs->f_).ss;
        uVar106 = *(undefined3 *)&(cs->f_).field_0xd;
        uVar94 = CONCAT31(uVar106,uVar82);
        uVar70 = CONCAT41(uVar94,uVar58);
        uVar46 = CONCAT51(uVar70,uVar34);
        uVar10._1_7_ = CONCAT61(uVar46,uVar22);
        dVar113 = detail::difference((detail *)pTVar112[-1].prev_civil_sec.f_.y,uVar9,(cs->f_).y,
                                     uVar10);
        (__return_storage_ptr__->pre).__d.__r =
             ~(dVar113 * 0x3c + (long)(((int)uVar9._1_7_ >> 0x18) - ((int)uVar10._1_7_ >> 0x18))) +
             lVar118;
        iVar114 = pTVar112[-1].unix_time;
        (__return_storage_ptr__->trans).__d.__r = iVar114;
        uVar11._0_1_ = (cs->f_).m;
        uVar23 = (cs->f_).d;
        uVar35 = (cs->f_).hh;
        uVar59 = (cs->f_).mm;
        uVar83 = (cs->f_).ss;
        uVar107 = *(undefined3 *)&(cs->f_).field_0xd;
        uVar95 = CONCAT31(uVar107,uVar83);
        uVar71 = CONCAT41(uVar95,uVar59);
        uVar47 = CONCAT51(uVar71,uVar35);
        uVar11._1_7_ = CONCAT61(uVar47,uVar23);
        uVar12._0_1_ = pTVar112[-1].civil_sec.f_.m;
        uVar24 = pTVar112[-1].civil_sec.f_.d;
        uVar36 = pTVar112[-1].civil_sec.f_.hh;
        uVar60 = pTVar112[-1].civil_sec.f_.mm;
        uVar84 = pTVar112[-1].civil_sec.f_.ss;
        uVar108 = *(undefined3 *)&pTVar112[-1].civil_sec.f_.field_0xd;
        uVar96 = CONCAT31(uVar108,uVar84);
        uVar72 = CONCAT41(uVar96,uVar60);
        uVar48 = CONCAT51(uVar72,uVar36);
        uVar12._1_7_ = CONCAT61(uVar48,uVar24);
        dVar113 = detail::difference((detail *)(cs->f_).y,uVar11,pTVar112[-1].civil_sec.f_.y,uVar12)
        ;
        iVar117 = ((int)uVar11._1_7_ >> 0x18) - ((int)uVar12._1_7_ >> 0x18);
        lVar118 = dVar113 * 0x3c;
        goto LAB_0010eccb;
      }
      if (this->extended_ == true) {
        lVar118 = (cs->f_).y;
        if (this->last_year_ < lVar118) {
          c4_shift = (~this->last_year_ + lVar118) / 400 + 1;
          fVar121 = detail::impl::n_sec(c4_shift * -400 + lVar118,(long)(cs->f_).m,(long)(cs->f_).d,
                                        (long)(cs->f_).hh,(long)(cs->f_).mm,(long)(cs->f_).ss);
          local_60.f_.y = fVar121.y;
          local_60.f_._8_8_ = fVar121._8_8_ & 0xffffffffff;
          TimeLocal(__return_storage_ptr__,this,&local_60,c4_shift);
          return __return_storage_ptr__;
        }
      }
      bVar111 = detail::operator<((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                   *)((long)&(((this->transition_types_).
                                               super__Vector_base<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->civil_max
                                             ).f_.y + (ulong)((uint)pTVar112[-1].type_index * 0x30))
                                  ,cs);
      if (bVar111) {
        __return_storage_ptr__->kind = UNIQUE;
        lVar118 = 0x7fffffffffffffff;
        goto LAB_0010ef47;
      }
LAB_0010ef02:
      uVar13._0_1_ = (cs->f_).m;
      uVar25 = (cs->f_).d;
      uVar37 = (cs->f_).hh;
      uVar61 = (cs->f_).mm;
      uVar85 = (cs->f_).ss;
      uVar109 = *(undefined3 *)&(cs->f_).field_0xd;
      uVar97 = CONCAT31(uVar109,uVar85);
      uVar73 = CONCAT41(uVar97,uVar61);
      uVar49 = CONCAT51(uVar73,uVar37);
      uVar13._1_7_ = CONCAT61(uVar49,uVar25);
      lVar118 = pTVar112[-1].unix_time;
      uVar14._0_1_ = pTVar112[-1].civil_sec.f_.m;
      uVar26 = pTVar112[-1].civil_sec.f_.d;
      uVar38 = pTVar112[-1].civil_sec.f_.hh;
      uVar62 = pTVar112[-1].civil_sec.f_.mm;
      uVar86 = pTVar112[-1].civil_sec.f_.ss;
      uVar110 = *(undefined3 *)&pTVar112[-1].civil_sec.f_.field_0xd;
      uVar98 = CONCAT31(uVar110,uVar86);
      uVar74 = CONCAT41(uVar98,uVar62);
      uVar50 = CONCAT51(uVar74,uVar38);
      uVar14._1_7_ = CONCAT61(uVar50,uVar26);
      dVar113 = detail::difference((detail *)(cs->f_).y,uVar13,pTVar112[-1].civil_sec.f_.y,uVar14);
      iVar117 = ((int)uVar13._1_7_ >> 0x18) - ((int)uVar14._1_7_ >> 0x18);
      lVar118 = dVar113 * 0x3c + lVar118;
      goto LAB_0010ef3d;
    }
    bVar111 = detail::operator<(&pTVar112->prev_civil_sec,cs);
    if (!bVar111) {
      bVar111 = detail::operator<(&pTVar112[-1].prev_civil_sec,cs);
      if (bVar111) goto LAB_0010ef02;
      goto LAB_0010ee3d;
    }
    __return_storage_ptr__->kind = SKIPPED;
    uVar2._0_1_ = (cs->f_).m;
    uVar15 = (cs->f_).d;
    uVar27 = (cs->f_).hh;
    uVar51 = (cs->f_).mm;
    uVar75 = (cs->f_).ss;
    uVar99 = *(undefined3 *)&(cs->f_).field_0xd;
    uVar87 = CONCAT31(uVar99,uVar75);
    uVar63 = CONCAT41(uVar87,uVar51);
    uVar39 = CONCAT51(uVar63,uVar27);
    uVar2._1_7_ = CONCAT61(uVar39,uVar15);
    lVar118 = pTVar112->unix_time;
    uVar3._0_1_ = (pTVar112->prev_civil_sec).f_.m;
    uVar16 = (pTVar112->prev_civil_sec).f_.d;
    uVar28 = (pTVar112->prev_civil_sec).f_.hh;
    uVar52 = (pTVar112->prev_civil_sec).f_.mm;
    uVar76 = (pTVar112->prev_civil_sec).f_.ss;
    uVar100 = *(undefined3 *)&(pTVar112->prev_civil_sec).f_.field_0xd;
    uVar88 = CONCAT31(uVar100,uVar76);
    uVar64 = CONCAT41(uVar88,uVar52);
    uVar40 = CONCAT51(uVar64,uVar28);
    uVar3._1_7_ = CONCAT61(uVar40,uVar16);
    dVar113 = detail::difference((detail *)(cs->f_).y,uVar2,(pTVar112->prev_civil_sec).f_.y,uVar3);
    (__return_storage_ptr__->pre).__d.__r =
         dVar113 * 0x3c + lVar118 + (long)(((int)uVar2._1_7_ >> 0x18) - ((int)uVar3._1_7_ >> 0x18))
         + -1;
    iVar114 = pTVar112->unix_time;
    (__return_storage_ptr__->trans).__d.__r = iVar114;
    pdVar115 = (detail *)(pTVar112->civil_sec).f_.y;
    uVar119._0_1_ = (pTVar112->civil_sec).f_.m;
    uVar119._1_1_ = (pTVar112->civil_sec).f_.d;
    uVar119._2_1_ = (pTVar112->civil_sec).f_.hh;
    uVar119._3_1_ = (pTVar112->civil_sec).f_.mm;
    uVar119._4_1_ = (pTVar112->civil_sec).f_.ss;
    uVar119._5_3_ = *(undefined3 *)&(pTVar112->civil_sec).f_.field_0xd;
  }
  uVar6._0_1_ = (cs->f_).m;
  uVar19 = (cs->f_).d;
  uVar31 = (cs->f_).hh;
  uVar55 = (cs->f_).mm;
  uVar79 = (cs->f_).ss;
  uVar103 = *(undefined3 *)&(cs->f_).field_0xd;
  uVar91 = CONCAT31(uVar103,uVar79);
  uVar67 = CONCAT41(uVar91,uVar55);
  uVar43 = CONCAT51(uVar67,uVar31);
  uVar6._1_7_ = CONCAT61(uVar43,uVar19);
  dVar113 = detail::difference(pdVar115,uVar119,(cs->f_).y,uVar6);
  iVar117 = ((int)uVar6._1_7_ >> 0x18) - ((int)((ulong)uVar119 >> 8) >> 0x18);
  lVar118 = dVar113 * -0x3c;
LAB_0010eccb:
  (__return_storage_ptr__->post).__d.__r = lVar118 + iVar114 + (long)iVar117;
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneInfo::MakeTime(const civil_second& cs) const {
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  // Find the first transition after our target civil time.
  const Transition* tr = nullptr;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + timecnt;
  if (cs < begin->civil_sec) {
    tr = begin;
  } else if (cs >= transitions_[timecnt - 1].civil_sec) {
    tr = end;
  } else {
    const std::size_t hint = time_local_hint_.load(std::memory_order_relaxed);
    if (0 < hint && hint < timecnt) {
      if (transitions_[hint - 1].civil_sec <= cs) {
        if (cs < transitions_[hint].civil_sec) {
          tr = begin + hint;
        }
      }
    }
    if (tr == nullptr) {
      const Transition target = {0, 0, cs, civil_second()};
      tr = std::upper_bound(begin, end, target, Transition::ByCivilTime());
      time_local_hint_.store(static_cast<std::size_t>(tr - begin),
                             std::memory_order_relaxed);
    }
  }

  if (tr == begin) {
    if (tr->prev_civil_sec >= cs) {
      // Before first transition, so use the default offset.
      const TransitionType& tt(transition_types_[default_transition_type_]);
      if (cs < tt.civil_min) return MakeUnique(time_point<seconds>::min());
      return MakeUnique(cs - (civil_second() + tt.utc_offset));
    }
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (tr == end) {
    if (cs > (--tr)->prev_civil_sec) {
      // After the last transition. If we extended the transitions using
      // future_spec_, shift back to a supported year using the 400-year
      // cycle of calendaric equivalence and then compensate accordingly.
      if (extended_ && cs.year() > last_year_) {
        const year_t shift = (cs.year() - last_year_ - 1) / 400 + 1;
        return TimeLocal(YearShift(cs, shift * -400), shift);
      }
      const TransitionType& tt(transition_types_[tr->type_index]);
      if (cs > tt.civil_max) return MakeUnique(time_point<seconds>::max());
      return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
    }
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  if (tr->prev_civil_sec < cs) {
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (cs <= (--tr)->prev_civil_sec) {
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  // In between transitions.
  return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
}